

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O3

shared_ptr<Liby::UdpSocket> __thiscall Liby::EventLoopGroup::creatUdpClient(EventLoopGroup *this)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int *in_RSI;
  shared_ptr<Liby::UdpSocket> sVar3;
  SockPtr sockPtr;
  bool local_31;
  shared_ptr<Liby::Socket> local_30;
  EventLoop *local_20;
  
  local_31 = true;
  local_30.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Socket *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Liby::Socket,std::allocator<Liby::Socket>,bool>
            (&local_30.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Socket **)&local_30,(allocator<Liby::Socket> *)&local_20,&local_31);
  Socket::setNoblock(local_30.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     true);
  if (*in_RSI == 0) {
    puVar1 = *(undefined8 **)(in_RSI + 0x18);
  }
  else {
    puVar1 = (undefined8 *)
             (*(long *)(in_RSI + 0x18) +
              (long)((local_30.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->fd_ % *in_RSI) * 8 + 8);
  }
  local_20 = (EventLoop *)*puVar1;
  std::__shared_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<Liby::UdpSocket>,Liby::EventLoop*,std::shared_ptr<Liby::Socket>&>
            ((__shared_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<Liby::UdpSocket> *)&local_31,&local_20,&local_30);
  _Var2._M_pi = extraout_RDX;
  if (local_30.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::UdpSocket>)
         sVar3.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UdpSocket> EventLoopGroup::creatUdpClient() {
    SockPtr sockPtr = std::make_shared<Socket>(true);
    sockPtr->setNoblock();
    std::shared_ptr<UdpSocket> udpSocket =
        std::make_shared<UdpSocket>(robinLoop1(sockPtr->fd()), sockPtr);
    return udpSocket;
}